

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_examples.cpp
# Opt level: O3

void psnrCharts(TRIPLEYCbCr **mrxYCbCr,BITMAPFILEHEADER bmFile,BITMAPINFOHEADER bmInfo)

{
  FILE *pFVar1;
  TRIPLEBYTES **ppTVar2;
  int sigma;
  uint uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  
  pFVar1 = fopen("lab2/noize/chartPSNRGause/psnr.csv","w");
  uVar4 = 1;
  do {
    fprintf(pFVar1,"%d,",uVar4);
    uVar3 = (int)uVar4 + 1;
    uVar4 = (ulong)uVar3;
  } while (uVar3 != 0x32);
  fputc(10,pFVar1);
  uVar4 = 1;
  dVar5 = 1.0;
  do {
    ppTVar2 = gause_noise((TRIPLEBYTES **)mrxYCbCr,bmInfo.biHeight,bmInfo.biWidth,dVar5,0);
    dVar6 = getPSNR((TRIPLEBYTES **)mrxYCbCr,ppTVar2,0,0,bmInfo.biHeight,bmInfo.biWidth,0);
    printf("sigma: %d\tPSNR[gauseNoize ; origin ] - %f\n",uVar4);
    fprintf(pFVar1,"%4.2f,",dVar6);
    clear_memory((TRIPLEYCbCr **)ppTVar2,bmInfo.biHeight);
    dVar5 = dVar5 + 1.0;
    uVar3 = (int)uVar4 + 1;
    uVar4 = (ulong)uVar3;
  } while (uVar3 != 0x32);
  fclose(pFVar1);
  pFVar1 = fopen("lab2/noize/chartPSNRImpulse/psnr.csv","w");
  dVar5 = 0.1;
  do {
    fprintf(pFVar1,"%4.2f,",dVar5);
    dVar5 = dVar5 + 0.1;
  } while (dVar5 <= 1.0);
  fputc(10,pFVar1);
  dVar5 = 0.1;
  do {
    ppTVar2 = impulse_noise((TRIPLEBYTES **)mrxYCbCr,bmInfo.biHeight,bmInfo.biWidth,0,dVar5 * 0.5,
                            dVar5 * 0.5);
    dVar6 = getPSNR((TRIPLEBYTES **)mrxYCbCr,ppTVar2,0,0,bmInfo.biHeight,bmInfo.biWidth,0);
    printf("prob: %f\tPSNR[gauseNoize ; origin ] - %f\n",dVar5,dVar6);
    fprintf(pFVar1,"%4.2f,",dVar6);
    clear_memory((TRIPLEYCbCr **)ppTVar2,bmInfo.biHeight);
    dVar5 = dVar5 + 0.1;
  } while (dVar5 <= 1.0);
  fclose(pFVar1);
  return;
}

Assistant:

void psnrCharts(TRIPLEYCbCr **mrxYCbCr, BITMAPFILEHEADER bmFile, BITMAPINFOHEADER bmInfo) {
    int min = 1;
    int max = 50;
    int step = 1;
    int h = bmInfo.biHeight;
    int w = bmInfo.biWidth;
    FILE *file = fopen("lab2/noize/chartPSNRGause/psnr.csv", "w");
    TRIPLEYCbCr **mrxGauseNoize;
    for (int sigma = min; sigma < max; sigma += step) {
        fprintf(file, "%d,", sigma);
    }
    fprintf(file, "\n");
    for (int sigma = min; sigma < max; sigma += step) {
        mrxGauseNoize = (TRIPLEYCbCr **) gause_noise((TRIPLEBYTES **) mrxYCbCr, bmInfo.biHeight,
                                                     bmInfo.biWidth, sigma, COMPONENT_Y);
        //printf("get noize\n");
        double psnr = getPSNR((TRIPLEBYTES **) mrxYCbCr, (TRIPLEBYTES **) mrxGauseNoize, 0, 0, h, w,
                              COMPONENT_Y);
        printf("sigma: %d\tPSNR[gauseNoize ; origin ] - %f\n", sigma, psnr);
        fprintf(file, "%4.2f,", psnr);
        clear_memory(mrxGauseNoize, h);
    }
    fclose(file);

    FILE *file2 = fopen("lab2/noize/chartPSNRImpulse/psnr.csv", "w");
    TRIPLEYCbCr **mrxImpulseNoize;
    for (double prob = 0.1; prob <= 1; prob += 0.1) {
        fprintf(file2, "%4.2f,", prob);
    }
    fprintf(file2, "\n");
    for (double prob = 0.1; prob <= 1; prob += 0.1) {
        mrxImpulseNoize = (TRIPLEYCbCr **) impulse_noise((TRIPLEBYTES **) mrxYCbCr, bmInfo.biHeight,
                                                         bmInfo.biWidth, COMPONENT_Y, prob / 2, prob / 2);
        //printf("get noize\n");
        double psnr = getPSNR((TRIPLEBYTES **) mrxYCbCr, (TRIPLEBYTES **) mrxImpulseNoize, 0, 0, h, w,
                              COMPONENT_Y);
        printf("prob: %f\tPSNR[gauseNoize ; origin ] - %f\n", prob, psnr);
        fprintf(file2, "%4.2f,", psnr);
        clear_memory(mrxImpulseNoize, h);
    }
    fclose(file2);
}